

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::PixelGameEngine::olc_CoreUpdate(PixelGameEngine *this)

{
  pointer ppPVar1;
  pointer pDVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  uint32_t in_R8D;
  DecalInstance *decal;
  pointer pDVar6;
  PGEX **ext_1;
  pointer ppPVar7;
  pointer pLVar8;
  pointer pLVar9;
  PGEX **ext;
  float fVar10;
  float fElapsedTime;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string sTitle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  (this->m_tp2).__d.__r = lVar5;
  fElapsedTime = (float)(lVar5 - (this->m_tp1).__d.__r) / 1e+09;
  (this->m_tp1).__d.__r = lVar5;
  this->fLastElapsed = fElapsedTime;
  (**(code **)(*platform + 0x50))();
  olc_CoreUpdate::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this->pKeyboardState,(HWButton *)this->pKeyOldState,
             this->pKeyNewState,(bool *)0x100,in_R8D);
  olc_CoreUpdate::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)this->pMouseState,(HWButton *)this->pMouseOldState,
             this->pMouseNewState,(bool *)0x5,in_R8D);
  this->vMousePos = this->vMousePosCache;
  this->nMouseWheelDelta = this->nMouseWheelDeltaCache;
  this->nMouseWheelDeltaCache = 0;
  ppPVar1 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar7 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar7 != ppPVar1; ppPVar7 = ppPVar7 + 1
      ) {
    (*(*ppPVar7)->_vptr_PGEX[2])(*ppPVar7,&fElapsedTime);
  }
  iVar3 = (*this->_vptr_PixelGameEngine[3])(fElapsedTime,this);
  if ((char)iVar3 == '\0') {
    LOCK();
    bAtomActive = 0;
    UNLOCK();
  }
  ppPVar1 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar7 = (this->vExtensions).super__Vector_base<olc::PGEX_*,_std::allocator<olc::PGEX_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppPVar7 != ppPVar1; ppPVar7 = ppPVar7 + 1
      ) {
    (*(*ppPVar7)->_vptr_PGEX[3])(fElapsedTime);
  }
  (**(code **)(*renderer + 0x78))(renderer,&this->vViewPos,&this->vViewSize);
  (**(code **)(*renderer + 0x80))(renderer,BLACK,1);
  pLVar9 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar9->bShow = true;
  pLVar9->bUpdate = true;
  this->nDecalMode = NORMAL;
  (**(code **)(*renderer + 0x30))();
  pLVar9 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while (pLVar8 = pLVar9,
        pLVar8 != (this->vLayers).
                  super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>._M_impl.
                  super__Vector_impl_data._M_start) {
    pLVar9 = pLVar8 + -1;
    if (pLVar8[-1].bShow == true) {
      if (pLVar8[-1].funcHook.super__Function_base._M_manager == (_Manager_type)0x0) {
        (**(code **)(*renderer + 0x70))(renderer,pLVar8[-1].nResID);
        if (pLVar8[-1].bUpdate == true) {
          (**(code **)(*renderer + 0x58))(renderer,pLVar8[-1].nResID,pLVar8[-1].pDrawTarget);
          pLVar8[-1].bUpdate = false;
        }
        (**(code **)(*renderer + 0x40))
                  (renderer,pLVar9,&pLVar8[-1].vScale,pLVar8[-1].tint.field_0.n);
        pDVar2 = pLVar8[-1].vecDecalInstance.
                 super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pDVar6 = pLVar8[-1].vecDecalInstance.
                      super__Vector_base<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>.
                      _M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar2;
            pDVar6 = pDVar6 + 1) {
          (**(code **)(*renderer + 0x48))(renderer,pDVar6);
        }
        std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::clear
                  (&pLVar8[-1].vecDecalInstance);
      }
      else {
        std::function<void_()>::operator()(&pLVar8[-1].funcHook);
      }
    }
  }
  (**(code **)(*renderer + 0x28))();
  fVar10 = fElapsedTime + this->fFrameTimer;
  this->fFrameTimer = fVar10;
  uVar4 = this->nFrameCount + 1;
  this->nFrameCount = uVar4;
  if (1.0 <= fVar10) {
    this->nLastFPS = uVar4;
    this->fFrameTimer = fVar10 + -1.0;
    std::operator+(&local_48,"OneLoneCoder.com - Pixel Game Engine - ",&this->sAppName);
    std::operator+(&local_88,&local_48," - FPS: ");
    std::__cxx11::to_string(&local_a8,this->nFrameCount);
    std::operator+(&sTitle,&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    (**(code **)(*platform + 0x40))(platform,&sTitle);
    this->nFrameCount = 0;
    std::__cxx11::string::~string((string *)&sTitle);
  }
  return;
}

Assistant:

void PixelGameEngine::olc_CoreUpdate()
	{
		// Handle Timing
		m_tp2 = std::chrono::system_clock::now();
		std::chrono::duration<float> elapsedTime = m_tp2 - m_tp1;
		m_tp1 = m_tp2;

		// Our time per frame coefficient
		float fElapsedTime = elapsedTime.count();
		fLastElapsed = fElapsedTime;

		// Some platforms will need to check for events
		platform->HandleSystemEvent();

		// Compare hardware input states from previous frame
		auto ScanHardware = [&](HWButton *pKeys, bool *pStateOld, bool *pStateNew, uint32_t nKeyCount) {
			for (uint32_t i = 0; i < nKeyCount; i++)
			{
				pKeys[i].bPressed = false;
				pKeys[i].bReleased = false;
				if (pStateNew[i] != pStateOld[i])
				{
					if (pStateNew[i])
					{
						pKeys[i].bPressed = !pKeys[i].bHeld;
						pKeys[i].bHeld = true;
					}
					else
					{
						pKeys[i].bReleased = true;
						pKeys[i].bHeld = false;
					}
				}
				pStateOld[i] = pStateNew[i];
			}
		};

		ScanHardware(pKeyboardState, pKeyOldState, pKeyNewState, 256);
		ScanHardware(pMouseState, pMouseOldState, pMouseNewState, nMouseButtons);

		// Cache mouse coordinates so they remain consistent during frame
		vMousePos = vMousePosCache;
		nMouseWheelDelta = nMouseWheelDeltaCache;
		nMouseWheelDeltaCache = 0;

		//	renderer->ClearBuffer(olc::BLACK, true);

		// Handle Frame Update
		for (auto &ext : vExtensions)
			ext->OnBeforeUserUpdate(fElapsedTime);
		if (!OnUserUpdate(fElapsedTime))
			bAtomActive = false;
		for (auto &ext : vExtensions)
			ext->OnAfterUserUpdate(fElapsedTime);

		// Display Frame
		renderer->UpdateViewport(vViewPos, vViewSize);
		renderer->ClearBuffer(olc::BLACK, true);

		// Layer 0 must always exist
		vLayers[0].bUpdate = true;
		vLayers[0].bShow = true;
		SetDecalMode(DecalMode::NORMAL);
		renderer->PrepareDrawing();

		for (auto layer = vLayers.rbegin(); layer != vLayers.rend(); ++layer)
		{
			if (layer->bShow)
			{
				if (layer->funcHook == nullptr)
				{
					renderer->ApplyTexture(layer->nResID);
					if (layer->bUpdate)
					{
						renderer->UpdateTexture(layer->nResID, layer->pDrawTarget);
						layer->bUpdate = false;
					}

					renderer->DrawLayerQuad(layer->vOffset, layer->vScale, layer->tint);

					// Display Decals in order for this layer
					for (auto &decal : layer->vecDecalInstance)
						renderer->DrawDecal(decal);
					layer->vecDecalInstance.clear();
				}
				else
				{
					// Mwa ha ha.... Have Fun!!!
					layer->funcHook();
				}
			}
		}

		// Present Graphics to screen
		renderer->DisplayFrame();

		// Update Title Bar
		fFrameTimer += fElapsedTime;
		nFrameCount++;
		if (fFrameTimer >= 1.0f)
		{
			nLastFPS = nFrameCount;
			fFrameTimer -= 1.0f;
			std::string sTitle = "OneLoneCoder.com - Pixel Game Engine - " + sAppName + " - FPS: " + std::to_string(nFrameCount);
			platform->SetWindowTitle(sTitle);
			nFrameCount = 0;
		}
	}